

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Show.cpp
# Opt level: O2

void rc::detail::showValue(string *value,ostream *os)

{
  undefined4 uVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  locale *__loc;
  byte __c;
  char *pcVar6;
  size_type sVar7;
  uint uVar8;
  
  __loc = (locale *)std::locale::classic();
  std::operator<<(os,'\"');
  pcVar2 = (value->_M_dataplus)._M_p;
  sVar3 = value->_M_string_length;
  sVar7 = 0;
  do {
    if (sVar3 == sVar7) {
      std::operator<<(os,'\"');
      return;
    }
    __c = pcVar2[sVar7];
    uVar8 = (uint)__c;
    bVar5 = std::isspace<char>(__c,__loc);
    if ((!bVar5) && (bVar5 = std::isprint<char>(__c,__loc), bVar5)) {
      if (uVar8 == 0x22) {
        pcVar6 = "\\\"";
        goto LAB_001559b1;
      }
      if (uVar8 == 0x5c) {
        pcVar6 = "\\";
        goto LAB_001559b1;
      }
LAB_00155958:
      std::operator<<(os,__c);
      goto LAB_001559b6;
    }
    switch(uVar8) {
    case 0:
      pcVar6 = "\\0";
      break;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
      goto switchD_001558ce_caseD_1;
    case 7:
      pcVar6 = "\\a";
      break;
    case 8:
      pcVar6 = "\\b";
      break;
    case 9:
      pcVar6 = "\\t";
      break;
    case 10:
      pcVar6 = "\\n";
      break;
    case 0xb:
      pcVar6 = "\\v";
      break;
    case 0xc:
      pcVar6 = "\\f";
      break;
    case 0xd:
      pcVar6 = "\\r";
      break;
    default:
      if (uVar8 == 0x20) {
        __c = 0x20;
        goto LAB_00155958;
      }
      goto switchD_001558ce_caseD_1;
    }
LAB_001559b1:
    std::operator<<(os,pcVar6);
LAB_001559b6:
    sVar7 = sVar7 + 1;
  } while( true );
switchD_001558ce_caseD_1:
  uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  std::operator<<(os,"\\x");
  lVar4 = *(long *)os;
  *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(os + *(long *)(lVar4 + -0x18) + 8) = 2;
  *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) | 0x4000;
  std::ostream::operator<<(os,uVar8);
  *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
  goto LAB_001559b6;
}

Assistant:

void showValue(const std::string &value, std::ostream &os) {
  const auto &locale = std::locale::classic();
  os << '"';
  for (char c : value) {
    if (!std::isspace(c, locale) && std::isprint(c, locale)) {
      switch (c) {
      case '\\':
        os << "\\";
        break;
      case '"':
        os << "\\\"";
        break;
      default:
        os << c;
      }
    } else {
      switch (c) {
      case 0x00:
        os << "\\0";
        break;
      case 0x07:
        os << "\\a";
        break;
      case 0x08:
        os << "\\b";
        break;
      case 0x0C:
        os << "\\f";
        break;
      case 0x0A:
        os << "\\n";
        break;
      case 0x0D:
        os << "\\r";
        break;
      case 0x09:
        os << "\\t";
        break;
      case 0x0B:
        os << "\\v";
        break;
      case ' ':
        os << ' ';
        break;
      default:
        auto flags = os.flags();
        os << "\\x";
        os << std::hex << std::setprecision(2) << std::uppercase
           << static_cast<int>(c & 0xFF);
        os.flags(flags);
      }
    }
  }
  os << '"';
}